

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

socket_t __thiscall httplib::Client::create_client_socket(Client *this)

{
  ulong uVar1;
  char *pcVar2;
  Client *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    this_local._4_4_ =
         detail::create_client_socket(pcVar2,this->proxy_port_,this->timeout_sec_,&this->interface_)
    ;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    this_local._4_4_ =
         detail::create_client_socket(pcVar2,this->port_,this->timeout_sec_,&this->interface_);
  }
  return this_local._4_4_;
}

Assistant:

inline socket_t Client::create_client_socket() const {
  if (!proxy_host_.empty()) {
    return detail::create_client_socket(proxy_host_.c_str(), proxy_port_,
                                        timeout_sec_, interface_);
  }
  return detail::create_client_socket(host_.c_str(), port_, timeout_sec_,
                                      interface_);
}